

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_mutex.h
# Opt level: O0

void __thiscall tthread::fast_mutex::lock(fast_mutex *this)

{
  bool bVar1;
  fast_mutex *in_RDI;
  bool gotLock;
  
  do {
    bVar1 = try_lock(in_RDI);
    if (!bVar1) {
      sched_yield();
    }
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

inline void lock()
    {
#if defined(_FAST_MUTEX_ASM_)
      bool gotLock;
      do {
        gotLock = try_lock();
        if(!gotLock)
        {
  #if defined(_TTHREAD_WIN32_)
          Sleep(0);
  #elif defined(_TTHREAD_POSIX_)
          sched_yield();
  #endif
        }
      } while(!gotLock);
#else
  #if defined(_TTHREAD_WIN32_)
      EnterCriticalSection(&mHandle);
  #elif defined(_TTHREAD_POSIX_)
      pthread_mutex_lock(&mHandle);
  #endif
#endif
    }